

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O2

bool __thiscall myutils::IpcConnection::do_connect(IpcConnection *this)

{
  uint uVar1;
  uint *puVar2;
  Connection_Callback *pCVar3;
  bool bVar4;
  SOCKET sock;
  int iVar5;
  int iVar6;
  long lVar7;
  rep rVar8;
  long lVar9;
  FileMapping *pFVar10;
  ConnectionSlotInfo *pCVar11;
  ssize_t sVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  thread *this_00;
  string *psVar13;
  ShmemQueue *this_01;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string addr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  uint64_t slot_pos;
  
  bVar4 = true;
  if (this->m_connected == false) {
    if (((this->m_addr)._M_string_length != 0) &&
       (lVar7 = std::chrono::_V2::system_clock::now(),
       199999999 < lVar7 - (this->m_last_connect_time).__d.__r)) {
      rVar8 = std::chrono::_V2::system_clock::now();
      (this->m_last_connect_time).__d.__r = rVar8;
      clear_data(this);
      ss.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ss.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ss.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_b8,"?",(allocator *)&slot_pos);
      psVar13 = &this->m_addr;
      lVar7 = 0;
      while (lVar9 = std::__cxx11::string::find_first_of((string *)psVar13,(ulong)&local_b8),
            lVar9 != -1) {
        std::__cxx11::string::substr((ulong)&addr,(ulong)psVar13);
        trim(&addr);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&ss,&addr);
        std::__cxx11::string::~string((string *)&addr);
        lVar7 = lVar9 + 1;
      }
      if (lVar7 != -1) {
        std::__cxx11::string::substr((ulong)&addr,(ulong)psVar13);
        trim(&addr);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&ss,&addr);
        std::__cxx11::string::~string((string *)&addr);
      }
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string((string *)&local_b8,"shm_tq_ipc_",&local_b9);
      std::__cxx11::string::substr
                ((ulong)&slot_pos,
                 (ulong)ss.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      std::operator+(&addr,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&slot_pos)
      ;
      std::__cxx11::string::~string((string *)&slot_pos);
      std::__cxx11::string::~string((string *)&local_b8);
      pFVar10 = (FileMapping *)operator_new(0x30);
      pFVar10->m_pMapAddress = (char *)0x0;
      pFVar10->m_filesize = 0;
      pFVar10->m_fd = -1;
      (pFVar10->m_id)._M_dataplus._M_p = (pointer)&(pFVar10->m_id).field_2;
      (pFVar10->m_id)._M_string_length = 0;
      (pFVar10->m_id).field_2._M_local_buf[0] = '\0';
      this->m_svr_shmem = pFVar10;
      bVar4 = FileMapping::open_shmem(pFVar10,&addr,0x9c50,false);
      if (bVar4) {
        pCVar11 = (ConnectionSlotInfo *)this->m_svr_shmem->m_pMapAddress;
        this->m_slot_info = pCVar11;
        if (pCVar11->slot_size == 400) {
          if (this->m_socket != -1) {
            ::close(this->m_socket);
            pCVar11 = this->m_slot_info;
          }
          sock = connect_socket("127.0.0.1",pCVar11->svr_port);
          this->m_socket = sock;
          if ((sock != -1) && (bVar4 = check_connect(sock,2), bVar4)) {
            set_socket_nonblock(this->m_socket,false);
            lVar7 = random();
            this->m_my_id = (long)(int)lVar7;
            sVar12 = ::send(this->m_socket,&this->m_my_id,8,0);
            if ((int)sVar12 == 8) {
              slot_pos = 0;
              sVar12 = recv(this->m_socket,&slot_pos,8,0);
              if ((((int)sVar12 == 8) &&
                  (pCVar11 = this->m_slot_info, slot_pos < pCVar11->slot_count)) &&
                 (pCVar11->slots[slot_pos].client_id.super___atomic_base<unsigned_long>._M_i ==
                  this->m_my_id)) {
                this->m_slot = pCVar11->slots + slot_pos;
                set_socket_nonblock(this->m_socket,true);
                pFVar10 = (FileMapping *)operator_new(0x30);
                pFVar10->m_pMapAddress = (char *)0x0;
                pFVar10->m_filesize = 0;
                pFVar10->m_fd = -1;
                (pFVar10->m_id)._M_dataplus._M_p = (pointer)&(pFVar10->m_id).field_2;
                (pFVar10->m_id)._M_string_length = 0;
                (pFVar10->m_id).field_2._M_local_buf[0] = '\0';
                this->m_my_shmem = pFVar10;
                std::__cxx11::string::string((string *)&local_b8,this->m_slot->shmem_name,&local_b9)
                ;
                psVar13 = &local_b8;
                bVar4 = FileMapping::open_shmem(pFVar10,psVar13,this->m_slot->shmem_size,false);
                iVar6 = (int)psVar13;
                std::__cxx11::string::~string((string *)&local_b8);
                if (bVar4) {
                  iVar5 = SharedSemaphore::open(this->m_slot->sem_send,iVar6);
                  this->m_sem_recv = (SharedSemaphore *)CONCAT44(extraout_var,iVar5);
                  iVar6 = SharedSemaphore::open(this->m_slot->sem_recv,iVar6);
                  this->m_sem_send = (SharedSemaphore *)CONCAT44(extraout_var_00,iVar6);
                  if (((SharedSemaphore *)CONCAT44(extraout_var_00,iVar6) != (SharedSemaphore *)0x0)
                     && (this->m_sem_recv != (SharedSemaphore *)0x0)) {
                    puVar2 = (uint *)this->m_my_shmem->m_pMapAddress;
                    uVar1 = puVar2[3];
                    this->m_send_queue = (ShmemQueue *)((long)(int)uVar1 + (long)puVar2);
                    ShmemQueue::init((ShmemQueue *)((long)(int)uVar1 + (long)puVar2),
                                     (EVP_PKEY_CTX *)(ulong)puVar2[2]);
                    this_01 = (ShmemQueue *)(this->m_my_shmem->m_pMapAddress + (int)puVar2[1]);
                    this->m_recv_queue = this_01;
                    ShmemQueue::init(this_01,(EVP_PKEY_CTX *)(ulong)*puVar2);
                    set_conn_stat(this,true);
                    this->m_should_exit = false;
                    this_00 = (thread *)operator_new(8);
                    local_b8._M_dataplus._M_p = (pointer)recv_run;
                    local_b8._M_string_length = 0;
                    local_b8.field_2._M_allocated_capacity = (size_type)this;
                    std::thread::
                    thread<std::_Bind<void(myutils::IpcConnection::*(myutils::IpcConnection*))()>,,void>
                              (this_00,(_Bind<void_(myutils::IpcConnection::*(myutils::IpcConnection_*))()>
                                        *)&local_b8);
                    this->m_recv_thread = this_00;
                    pCVar3 = this->m_callback;
                    if (pCVar3 != (Connection_Callback *)0x0) {
                      (*pCVar3->_vptr_Connection_Callback[2])(pCVar3,1);
                    }
                    std::__cxx11::string::~string((string *)&addr);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&ss);
                    return true;
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&addr);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ss);
      clear_data(this);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool IpcConnection::do_connect() 
{
    if (m_connected) return true;

    if (m_addr.empty()) return false;

    if (system_clock::now() - m_last_connect_time < milliseconds(200))
        return false;

    m_last_connect_time = system_clock::now();

    clear_data();

    do {
        vector<string> ss;
        split(m_addr, "?", &ss);
        string addr = string("shm_tq_ipc_") + ss[0].substr(6);
        m_svr_shmem = new myutils::FileMapping();
        if (!m_svr_shmem) break;
        if (!m_svr_shmem->open_shmem(addr, sizeof(ConnectionSlotInfo), false))
            break;

        m_slot_info = (ConnectionSlotInfo*)m_svr_shmem->addr();
        if (m_slot_info->slot_size != sizeof(ConnectionSlot)) break;

        if (m_socket != INVALID_SOCKET)
            closesocket(m_socket);

        m_socket = connect_socket("127.0.0.1", m_slot_info->svr_port);
        if (m_socket == INVALID_SOCKET || !myutils::check_connect(m_socket, 2))
            break;

        set_socket_nonblock(m_socket, false);
        m_my_id = (uint64_t)myutils::random();
        int r = ::send(m_socket, (const char*)&m_my_id, sizeof(m_my_id), 0);
        if (r != sizeof(m_my_id))
            break;

        uint64_t slot_pos = 0;
        r = ::recv(m_socket, (char*)&slot_pos, sizeof(slot_pos), 0);
        if (r != sizeof(slot_pos))
            break;
	
        if (slot_pos >= m_slot_info->slot_count) break;

        auto slot = m_slot_info->slots + slot_pos;
        if (slot->client_id != m_my_id) break;

        m_slot = slot;
        set_socket_nonblock(m_socket, true);

        m_my_shmem = new myutils::FileMapping();
        if (!m_my_shmem->open_shmem(m_slot->shmem_name, m_slot->shmem_size, false))
            break;

        m_sem_recv = SharedSemaphore::open(m_slot->sem_send);
        m_sem_send = SharedSemaphore::open(m_slot->sem_recv);
        if (!m_sem_recv || !m_sem_send) break;

        ShmemHead* head = (ShmemHead*)m_my_shmem->addr();

        // different between client and server
        m_send_queue = (ShmemQueue*)(m_my_shmem->addr() + head->recv_offset);
        m_send_queue->init(head->recv_size);
        m_recv_queue = (ShmemQueue*)(m_my_shmem->addr() + head->send_offset);
        m_recv_queue->init(head->send_size);

        set_conn_stat(true);
        m_should_exit = false;
        m_recv_thread = new thread(bind(&IpcConnection::recv_run, this));

        if (m_callback)
            m_callback->on_conn_status(true);

        return true;

    } while (false);

    clear_data();

    return false;
}